

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> * __thiscall
node::BlockManager::GetAllBlockIndices
          (vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *__return_storage_ptr__,
          BlockManager *this)

{
  __node_base *p_Var1;
  long in_FS_OFFSET;
  CBlockIndex *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::reserve
            (__return_storage_ptr__,(this->m_block_index)._M_h._M_element_count);
  p_Var1 = &(this->m_block_index)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    local_28 = (CBlockIndex *)(p_Var1 + 5);
    std::vector<CBlockIndex*,std::allocator<CBlockIndex*>>::emplace_back<CBlockIndex*>
              ((vector<CBlockIndex*,std::allocator<CBlockIndex*>> *)__return_storage_ptr__,&local_28
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CBlockIndex*> BlockManager::GetAllBlockIndices()
{
    AssertLockHeld(cs_main);
    std::vector<CBlockIndex*> rv;
    rv.reserve(m_block_index.size());
    for (auto& [_, block_index] : m_block_index) {
        rv.push_back(&block_index);
    }
    return rv;
}